

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool Grammar::is_keyword_message(string *str)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = is_keyword_message_part(str);
  bVar6 = true;
  if ((!bVar2) && (iVar1 = (int)str->_M_string_length, bVar6 = 0 < iVar1, 0 < iVar1)) {
    lVar7 = 0;
    do {
      bVar2 = str_utils::is_space((str->_M_dataplus)._M_p[lVar7]);
      if (bVar2) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
        bVar3 = is_keyword_message_part(&local_50);
        if (!bVar3) goto LAB_00141930;
        std::__cxx11::string::substr((ulong)&local_90,(ulong)str);
        str_utils::ltrim(&local_70,&local_90);
        bVar4 = is_keyword_message(&local_70);
        bVar3 = true;
      }
      else {
LAB_00141930:
        bVar3 = false;
        bVar4 = false;
      }
      if (bVar3) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (bVar4 != false) {
        return bVar6;
      }
      lVar7 = lVar7 + 1;
      lVar5 = (long)(int)str->_M_string_length;
      bVar6 = lVar7 < lVar5;
    } while (lVar7 < lVar5);
  }
  return bVar6;
}

Assistant:

bool Grammar::is_keyword_message(const std::string& str) {
    if (is_keyword_message_part(str))
        return true;
    for (int i = 0; i < int(str.size()); i++)
        if (str_utils::is_space(str[i]) && is_keyword_message_part(str.substr(0, i)) &&
            is_keyword_message(str_utils::ltrim(str.substr(i + 1))))
            return true;
    return false;
}